

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_fre.cc
# Opt level: O0

void ASN1_template_free(ASN1_VALUE **pval,ASN1_TEMPLATE *tt)

{
  ASN1_VALUE *pAVar1;
  ASN1_VALUE *pAVar2;
  ASN1_VALUE *local_30;
  ASN1_VALUE *vtmp;
  size_t i;
  stack_st_ASN1_VALUE *sk;
  ASN1_TEMPLATE *tt_local;
  ASN1_VALUE **pval_local;
  
  sk = (stack_st_ASN1_VALUE *)tt;
  tt_local = (ASN1_TEMPLATE *)pval;
  if ((tt->flags & 6) == 0) {
    ASN1_item_ex_free(pval,(ASN1_ITEM *)tt->field_name);
  }
  else {
    i = (size_t)*pval;
    vtmp = (ASN1_VALUE *)0x0;
    while( true ) {
      pAVar1 = vtmp;
      pAVar2 = (ASN1_VALUE *)sk_ASN1_VALUE_num((stack_st_ASN1_VALUE *)i);
      if (pAVar2 <= pAVar1) break;
      local_30 = sk_ASN1_VALUE_value((stack_st_ASN1_VALUE *)i,(size_t)vtmp);
      ASN1_item_ex_free((ASN1_VALUE **)&local_30,*(ASN1_ITEM **)(sk + 0x18));
      vtmp = vtmp + 1;
    }
    sk_ASN1_VALUE_free((stack_st_ASN1_VALUE *)i);
    tt_local->flags = 0;
    tt_local->tag = 0;
  }
  return;
}

Assistant:

void ASN1_template_free(ASN1_VALUE **pval, const ASN1_TEMPLATE *tt) {
  if (tt->flags & ASN1_TFLG_SK_MASK) {
    STACK_OF(ASN1_VALUE) *sk = (STACK_OF(ASN1_VALUE) *)*pval;
    for (size_t i = 0; i < sk_ASN1_VALUE_num(sk); i++) {
      ASN1_VALUE *vtmp = sk_ASN1_VALUE_value(sk, i);
      ASN1_item_ex_free(&vtmp, ASN1_ITEM_ptr(tt->item));
    }
    sk_ASN1_VALUE_free(sk);
    *pval = NULL;
  } else {
    ASN1_item_ex_free(pval, ASN1_ITEM_ptr(tt->item));
  }
}